

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct64_stage9_sse4_1
               (__m128i *u,__m128i *cospim32,__m128i *cospi32,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rnding,int bit)

{
  longlong in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  long in_RDI;
  __m128i *in_R8;
  __m128i *palVar1;
  __m128i *in_R9;
  __m128i *palVar2;
  __m128i *out1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  __m128i *extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  __m128i *extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i temp4;
  __m128i temp3;
  __m128i temp2;
  __m128i temp1;
  int i;
  __m128i *in_stack_ffffffffffffff88;
  __m128i *in_stack_ffffffffffffff90;
  undefined4 local_34;
  
  palVar1 = in_R8;
  palVar2 = in_R9;
  for (local_34 = 0; (int)local_34 < 8; local_34 = local_34 + 1) {
    in0[0] = in_RDI + (long)(int)local_34 * 0x10;
    in0[1] = in_RDI + (long)(int)(0xf - local_34) * 0x10;
    in1[1] = (longlong)in_R8;
    in1[0] = in_RCX;
    addsub_sse4_1(in0,in1,palVar1,palVar2,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  }
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x140),in_RDX,(__m128i *)(in_RDI + 0x1b0),in_R9,
                  (uint)temp4[1]);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x150),in_RDX,(__m128i *)(in_RDI + 0x1a0),in_R9,
                  (uint)temp4[1]);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x160),in_RDX,(__m128i *)(in_RDI + 400),in_R9,
                  (uint)temp4[1]);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x170),in_RDX,(__m128i *)(in_RDI + 0x180),in_R9,
                  (uint)temp4[1]);
  palVar1 = extraout_XMM0_Qa_02;
  palVar2 = extraout_XMM0_Qb_02;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x170),in_RDX,(__m128i *)(in_RDI + 0x180),in_R9,
                  (uint)temp4[1]);
  *(undefined8 *)(in_RDI + 0x180) = extraout_XMM0_Qa_03;
  *(undefined8 *)(in_RDI + 0x188) = extraout_XMM0_Qb_03;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x160),in_RDX,(__m128i *)(in_RDI + 400),in_R9,
                  (uint)temp4[1]);
  *(undefined8 *)(in_RDI + 400) = extraout_XMM0_Qa_04;
  *(undefined8 *)(in_RDI + 0x198) = extraout_XMM0_Qb_04;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x150),in_RDX,(__m128i *)(in_RDI + 0x1a0),in_R9,
                  (uint)temp4[1]);
  *(undefined8 *)(in_RDI + 0x1a0) = extraout_XMM0_Qa_05;
  *(undefined8 *)(in_RDI + 0x1a8) = extraout_XMM0_Qb_05;
  out1 = (__m128i *)(ulong)(uint)temp4[1];
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x140),in_RDX,(__m128i *)(in_RDI + 0x1b0),in_R9,
                  (uint)temp4[1]);
  *(undefined8 *)(in_RDI + 0x1b0) = extraout_XMM0_Qa_06;
  *(undefined8 *)(in_RDI + 0x1b8) = extraout_XMM0_Qb_06;
  *(undefined8 *)(in_RDI + 0x140) = extraout_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x148) = extraout_XMM0_Qb;
  *(undefined8 *)(in_RDI + 0x150) = extraout_XMM0_Qa_00;
  *(undefined8 *)(in_RDI + 0x158) = extraout_XMM0_Qb_00;
  *(undefined8 *)(in_RDI + 0x160) = extraout_XMM0_Qa_01;
  *(undefined8 *)(in_RDI + 0x168) = extraout_XMM0_Qb_01;
  *(__m128i **)(in_RDI + 0x170) = palVar1;
  *(__m128i **)(in_RDI + 0x178) = palVar2;
  for (local_34 = 0x20; (int)local_34 < 0x28; local_34 = local_34 + 1) {
    in0_00[0] = in_RDI + (long)(int)local_34 * 0x10;
    in0_00[1] = in_RDI + (long)(int)(local_34 ^ 0xf) * 0x10;
    in1_00[1] = (longlong)in_R8;
    in1_00[0] = in_RCX;
    addsub_sse4_1(in0_00,in1_00,in_R9,out1,palVar1,palVar2);
  }
  for (local_34 = 0x30; (int)local_34 < 0x38; local_34 = local_34 + 1) {
    in0_01[0] = in_RDI + (long)(int)(local_34 ^ 0xf) * 0x10;
    in0_01[1] = in_RDI + (long)(int)local_34 * 0x10;
    in1_01[1] = (longlong)in_R8;
    in1_01[0] = in_RCX;
    addsub_sse4_1(in0_01,in1_01,in_R9,out1,palVar1,palVar2);
  }
  return;
}

Assistant:

static inline void idct64_stage9_sse4_1(__m128i *u, const __m128i *cospim32,
                                        const __m128i *cospi32,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi,
                                        const __m128i *rnding, int bit) {
  int i;
  __m128i temp1, temp2, temp3, temp4;
  for (i = 0; i < 8; ++i) {
    addsub_sse4_1(u[i], u[15 - i], &u[i], &u[15 - i], clamp_lo, clamp_hi);
  }

  temp1 = half_btf_sse4_1(cospim32, &u[20], cospi32, &u[27], rnding, bit);
  temp2 = half_btf_sse4_1(cospim32, &u[21], cospi32, &u[26], rnding, bit);
  temp3 = half_btf_sse4_1(cospim32, &u[22], cospi32, &u[25], rnding, bit);
  temp4 = half_btf_sse4_1(cospim32, &u[23], cospi32, &u[24], rnding, bit);
  u[24] = half_btf_sse4_1(cospi32, &u[23], cospi32, &u[24], rnding, bit);
  u[25] = half_btf_sse4_1(cospi32, &u[22], cospi32, &u[25], rnding, bit);
  u[26] = half_btf_sse4_1(cospi32, &u[21], cospi32, &u[26], rnding, bit);
  u[27] = half_btf_sse4_1(cospi32, &u[20], cospi32, &u[27], rnding, bit);
  u[20] = temp1;
  u[21] = temp2;
  u[22] = temp3;
  u[23] = temp4;
  for (i = 32; i < 40; i++) {
    addsub_sse4_1(u[i], u[i ^ 15], &u[i], &u[i ^ 15], clamp_lo, clamp_hi);
  }

  for (i = 48; i < 56; i++) {
    addsub_sse4_1(u[i ^ 15], u[i], &u[i ^ 15], &u[i], clamp_lo, clamp_hi);
  }
}